

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  ushort uVar1;
  u32 uVar2;
  Btree *pBtree;
  BtShared *pBt;
  MemPage *pPage;
  MemPage *pMVar3;
  u8 *puVar4;
  int iVar5;
  u16 uVar6;
  int iVar7;
  int iVar8;
  char cVar9;
  undefined8 uVar10;
  char cVar11;
  uchar *pCell;
  long lVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  uchar *puVar14;
  ulong uVar15;
  MemPage **ppMVar16;
  uint uVar17;
  CellInfo info;
  int local_78;
  int local_74;
  MemPage **local_70;
  ulong local_68;
  Pgno local_60;
  undefined4 local_5c;
  MemPage *local_58;
  u8 *local_50;
  CellInfo local_48;
  
  uVar13 = CONCAT71(in_register_00000031,flags);
  pBtree = pCur->pBtree;
  pBt = pBtree->pBt;
  if (pCur->eState != 0) {
    if (pCur->eState < 3) {
      uVar10 = 0x12ecb;
      goto LAB_00161b5a;
    }
    iVar7 = btreeRestoreCursorPosition(pCur);
    if (iVar7 != 0) {
      return iVar7;
    }
    uVar13 = uVar13 & 0xffffffff;
    if (pCur->eState != '\0') {
      return 0;
    }
  }
  uVar15 = (ulong)pCur->ix;
  pPage = pCur->pPage;
  if (pPage->nCell <= pCur->ix) {
    uVar10 = 0x12ed4;
    goto LAB_00161b5a;
  }
  local_74 = (int)pCur->iPage;
  pCell = pPage->aData +
          (CONCAT11(pPage->aCellIdx[uVar15 * 2],pPage->aCellIdx[uVar15 * 2 + 1]) & pPage->maskPage);
  local_68 = uVar15;
  if (pPage->nFree < 0) {
    uVar13 = uVar13 & 0xffffffff;
    iVar7 = btreeComputeFreeSpace(pPage);
    if (iVar7 != 0) {
      uVar10 = 0x12ed8;
      goto LAB_00161b5a;
    }
  }
  iVar7 = (int)uVar13;
  if ((uVar13 & 2) == 0) {
LAB_001619db:
    local_5c = 0;
  }
  else {
    if (pPage->leaf == '\0') {
LAB_001619c7:
      local_78 = saveCursorKey(pCur);
      if (local_78 != 0) {
        return local_78;
      }
      goto LAB_001619db;
    }
    iVar8 = pPage->nFree;
    puVar14 = pCell;
    uVar6 = (*pPage->xCellSize)(pPage,pCell);
    iVar7 = (int)puVar14;
    iVar8 = (uint)uVar6 + iVar8 + 2;
    if (((int)((pBt->usableSize * 2) / 3) < iVar8) ||
       (local_5c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar8 >> 8),1), pPage->nCell == 1))
    goto LAB_001619c7;
  }
  if ((pPage->leaf == '\0') && (iVar7 = sqlite3BtreePrevious(pCur,iVar7), iVar7 != 0)) {
    return iVar7;
  }
  if (((pCur->curFlags & 0x20) != 0) &&
     (iVar7 = saveAllCursors(pBt,pCur->pgnoRoot,pCur), iVar7 != 0)) {
    return iVar7;
  }
  if ((pCur->pKeyInfo == (KeyInfo *)0x0) && (pBtree->hasIncrblobCur != '\0')) {
    invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,(pCur->info).nKey,0);
  }
  iVar7 = sqlite3PagerWrite(pPage->pDbPage);
  if (iVar7 != 0) {
    return iVar7;
  }
  (*pPage->xParseCell)(pPage,pCell,&local_48);
  iVar7 = 0;
  if (local_48.nPayload != local_48.nLocal) {
    iVar7 = clearCellOverflow(pPage,pCell,&local_48);
  }
  local_78 = iVar7;
  dropCell(pPage,(int)local_68,(uint)local_48.nSize,&local_78);
  iVar7 = local_74;
  if (local_78 != 0) {
    return local_78;
  }
  lVar12 = (long)local_74;
  if (pPage->leaf == '\0') {
    ppMVar16 = &pCur->pPage;
    pMVar3 = *ppMVar16;
    if ((pMVar3->nFree < 0) &&
       (local_70 = ppMVar16, iVar8 = btreeComputeFreeSpace(pMVar3), ppMVar16 = local_70, iVar8 != 0)
       ) {
      return iVar8;
    }
    if (iVar7 < pCur->iPage + -1) {
      ppMVar16 = pCur->apPage + lVar12 + 1;
    }
    uVar17 = (uint)(CONCAT11(pMVar3->aCellIdx[(ulong)pMVar3->nCell * 2 + -2],
                             pMVar3->aCellIdx[(ulong)pMVar3->nCell * 2 + -1]) & pMVar3->maskPage);
    if (uVar17 < 4) {
      uVar10 = 0x12f33;
LAB_00161b5a:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      return 0xb;
    }
    local_60 = (*ppMVar16)->pgno;
    puVar4 = pMVar3->aData;
    local_58 = pMVar3;
    uVar6 = (*pMVar3->xCellSize)(pMVar3,puVar4 + uVar17);
    pMVar3 = local_58;
    local_70 = (MemPage **)(ulong)uVar6;
    local_50 = pBt->pTmpSpace;
    local_78 = sqlite3PagerWrite(local_58->pDbPage);
    if (local_78 == 0) {
      insertCell(pPage,(int)local_68,puVar4 + uVar17 + -4,(int)local_70 + 4,local_50,local_60,
                 &local_78);
    }
    dropCell(pMVar3,pMVar3->nCell - 1,(int)local_70,&local_78);
    if (local_78 != 0) {
      return local_78;
    }
  }
  iVar8 = pCur->pPage->nFree * 3;
  uVar2 = pCur->pBt->usableSize;
  iVar5 = uVar2 * 2;
  if ((iVar8 != iVar5 && SBORROW4(iVar8,iVar5) == (int)(iVar8 + uVar2 * -2) < 0) &&
     (iVar8 = balance(pCur), iVar8 != 0)) {
    return iVar8;
  }
  cVar11 = (char)iVar7;
  if (cVar11 < pCur->iPage) {
    sqlite3PagerUnrefNotNull(pCur->pPage->pDbPage);
    cVar9 = pCur->iPage + -1;
    pCur->iPage = cVar9;
    if ((char)local_74 < cVar9) {
      do {
        pCur->iPage = cVar9 + -1;
        lVar12 = (long)cVar9;
        cVar9 = cVar9 + -1;
        if (pCur->apPage[lVar12] != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pCur->apPage[lVar12]->pDbPage);
          cVar9 = pCur->iPage;
        }
      } while (cVar11 < cVar9);
    }
    pCur->pPage = pCur->apPage[cVar9];
    iVar7 = balance(pCur);
    if (iVar7 != 0) {
      return iVar7;
    }
  }
  if ((char)local_5c != '\0') {
    pCur->eState = '\x02';
    uVar1 = pPage->nCell;
    if ((ushort)local_68 < uVar1) {
      pCur->skipNext = 1;
    }
    else {
      pCur->skipNext = -1;
      pCur->ix = uVar1 - 1;
    }
    return 0;
  }
  iVar7 = moveToRoot(pCur);
  if ((uVar13 & 2) != 0) {
    btreeReleaseAllCursorPages(pCur);
    pCur->eState = '\x03';
  }
  if (iVar7 == 0x10) {
    return 0;
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  int rc;                    /* Return code */
  MemPage *pPage;            /* Page to delete cell from */
  unsigned char *pCell;      /* Pointer to cell to delete */
  int iCellIdx;              /* Index of cell to delete */
  int iCellDepth;            /* Depth of node containing pCell */
  CellInfo info;             /* Size of the cell being deleted */
  u8 bPreserve;              /* Keep cursor valid.  2 for CURSOR_SKIPNEXT */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );
  if( pCur->eState!=CURSOR_VALID ){
    if( pCur->eState>=CURSOR_REQUIRESEEK ){
      rc = btreeRestoreCursorPosition(pCur);
      assert( rc!=SQLITE_OK || CORRUPT_DB || pCur->eState==CURSOR_VALID );
      if( rc || pCur->eState!=CURSOR_VALID ) return rc;
    }else{
      return SQLITE_CORRUPT_BKPT;
    }
  }
  assert( pCur->eState==CURSOR_VALID );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  if( pPage->nCell<=iCellIdx ){
    return SQLITE_CORRUPT_BKPT;
  }
  pCell = findCell(pPage, iCellIdx);
  if( pPage->nFree<0 && btreeComputeFreeSpace(pPage) ){
    return SQLITE_CORRUPT_BKPT;
  }

  /* If the BTREE_SAVEPOSITION bit is on, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before
  ** returning.
  **
  ** If the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry.
  **
  ** The bPreserve value records which path is required:
  **
  **    bPreserve==0         Not necessary to save the cursor position
  **    bPreserve==1         Use CURSOR_REQUIRESEEK to save the cursor position
  **    bPreserve==2         Cursor won't move.  Set CURSOR_SKIPNEXT.
  */
  bPreserve = (flags & BTREE_SAVEPOSITION)!=0;
  if( bPreserve ){
    if( !pPage->leaf
     || (pPage->nFree+pPage->xCellSize(pPage,pCell)+2) >
                                                   (int)(pBt->usableSize*2/3)
     || pPage->nCell==1  /* See dbfuzz001.test for a test case */
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bPreserve = 2;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 && p->hasIncrblobCur ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  BTREE_CLEAR_CELL(rc, pPage, pCell, info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( pLeaf->nFree<0 ){
      rc = btreeComputeFreeSpace(pLeaf);
      if( rc ) return rc;
    }
    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as
  ** well.  */
  assert( pCur->pPage->nOverflow==0 );
  assert( pCur->pPage->nFree>=0 );
  if( pCur->pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
    /* Optimization: If the free space is less than 2/3rds of the page,
    ** then balance() will always be a no-op.  No need to invoke it. */
    rc = SQLITE_OK;
  }else{
    rc = balance(pCur);
  }
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bPreserve>1 ){
      assert( (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}